

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerOpenWalIfPresent(Pager *pPager)

{
  long lVar1;
  sqlite3_vfs *in_RDI;
  long in_FS_OFFSET;
  int rc;
  Pgno nPage;
  int isWal;
  uint in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (*(char *)&in_RDI->pNext == '\0') {
    iVar3 = -0x55555556;
    iVar2 = sqlite3OsAccess((sqlite3_vfs *)CONCAT44(0xaaaaaaaa,in_stack_fffffffffffffff0),
                            (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                            (int)((ulong)in_RDI >> 0x20),(int *)(ulong)in_stack_ffffffffffffffd8);
    if (iVar2 == 0) {
      if (iVar3 == 0) {
        if (*(char *)((long)&in_RDI->mxPathname + 1) == '\x05') {
          *(undefined1 *)((long)&in_RDI->mxPathname + 1) = 0;
        }
      }
      else {
        iVar3 = -0x55555556;
        iVar2 = pagerPagecount((Pager *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                ),(Pgno *)in_RDI);
        if (iVar2 == 0) {
          if (iVar3 == 0) {
            iVar2 = sqlite3OsDelete(in_RDI,(char *)(ulong)in_stack_ffffffffffffffd8,0);
          }
          else {
            iVar2 = sqlite3PagerOpenWal((Pager *)CONCAT44(in_stack_ffffffffffffffec,
                                                          in_stack_ffffffffffffffe8),
                                        &in_RDI->iVersion);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int pagerOpenWalIfPresent(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );

  if( !pPager->tempFile ){
    int isWal;                    /* True if WAL file exists */
    rc = sqlite3OsAccess(
        pPager->pVfs, pPager->zWal, SQLITE_ACCESS_EXISTS, &isWal
    );
    if( rc==SQLITE_OK ){
      if( isWal ){
        Pgno nPage;                   /* Size of the database file */

        rc = pagerPagecount(pPager, &nPage);
        if( rc ) return rc;
        if( nPage==0 ){
          rc = sqlite3OsDelete(pPager->pVfs, pPager->zWal, 0);
        }else{
          testcase( sqlite3PcachePagecount(pPager->pPCache)==0 );
          rc = sqlite3PagerOpenWal(pPager, 0);
        }
      }else if( pPager->journalMode==PAGER_JOURNALMODE_WAL ){
        pPager->journalMode = PAGER_JOURNALMODE_DELETE;
      }
    }
  }
  return rc;
}